

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O2

void __thiscall soplex::SPxFastRT<double>::tighten(SPxFastRT<double> *this)

{
  shared_ptr<soplex::Tolerances> *psVar1;
  ulong uVar2;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_58;
  double local_48;
  undefined8 uStack_40;
  double local_38;
  undefined8 uStack_30;
  double local_28;
  undefined8 uStack_20;
  
  psVar1 = &(this->super_SPxRatioTester<double>)._tolerances;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_58,&psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  uVar2 = -(ulong)((local_58._M_ptr)->s_epsilon_multiplier == 1.0);
  local_48 = (double)(~uVar2 & (ulong)((local_58._M_ptr)->s_epsilon_multiplier * 1e-05) |
                     uVar2 & 0x3ee4f8b588e368f1);
  uStack_40 = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  if ((this->super_SPxRatioTester<double>).delta + local_48 <= this->fastDelta) {
    local_38 = this->fastDelta - local_48;
    this->fastDelta = local_38;
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_58,&psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
              );
    uVar2 = -(ulong)((local_58._M_ptr)->s_epsilon_multiplier == 1.0);
    local_28 = (double)(~uVar2 & (ulong)((local_58._M_ptr)->s_epsilon_multiplier * 0.0001) |
                       uVar2 & 0x3f1a36e2eb1c432d);
    uStack_20 = 0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
    if (local_28 < local_38) {
      this->fastDelta = this->fastDelta - (local_48 + local_48);
    }
  }
  local_48 = this->minStab;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_58,&psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  uVar2 = -(ulong)((local_58._M_ptr)->s_epsilon_multiplier == 1.0);
  local_38 = (double)(~uVar2 & (ulong)((local_58._M_ptr)->s_epsilon_multiplier * 1e-05) |
                     uVar2 & 0x3ee4f8b588e368f1);
  uStack_30 = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  if (local_48 < local_38) {
    local_48 = this->minStab / 0.9;
    this->minStab = local_48;
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_58,&psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
              );
    local_38 = Tolerances::floatingPointFeastol(local_58._M_ptr);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
    if (local_48 < local_38) {
      this->minStab = this->minStab / 0.9;
    }
  }
  return;
}

Assistant:

void SPxFastRT<R>::tighten()
{
   R delta_shift = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_DELTA_SHIFT);

   if(fastDelta >= this->delta + delta_shift)
   {
      fastDelta -= delta_shift;

      if(fastDelta > this->tolerances()->scaleAccordingToEpsilon(1e-4))
         fastDelta -= 2 * delta_shift;
   }

   if(minStab < this->tolerances()->scaleAccordingToEpsilon(SOPLEX_MINSTAB))
   {
      minStab /= 0.90;

      if(minStab < this->tolerances()->floatingPointFeastol())
         minStab /= 0.90;
   }
}